

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film_grain_table_test.cc
# Opt level: O0

void __thiscall
FilmGrainEncodeTest_InitMonochrome1EncodeMonochrome0_Test::TestBody
          (FilmGrainEncodeTest_InitMonochrome1EncodeMonochrome0_Test *this)

{
  bool bVar1;
  Type type;
  aom_codec_err_t line;
  aom_codec_err_t aVar2;
  AssertHelper *this_00;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  aom_image_t img;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  size_t kBufferSize;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  aom_codec_err_t init_status;
  aom_codec_ctx_t enc;
  AssertionResult gtest_ar;
  aom_codec_enc_cfg_t cfg;
  aom_codec_iface_t *iface;
  int usage;
  int kHeight;
  int kWidth;
  aom_codec_ctx_t *in_stack_fffffffffffff8e8;
  AssertHelper *in_stack_fffffffffffff8f0;
  undefined4 in_stack_fffffffffffff8f8;
  undefined4 in_stack_fffffffffffff8fc;
  aom_codec_iface_t *in_stack_fffffffffffff900;
  undefined4 in_stack_fffffffffffff908;
  undefined4 uVar3;
  int in_stack_fffffffffffff90c;
  aom_codec_enc_cfg_t *in_stack_fffffffffffff910;
  uint in_stack_fffffffffffff918;
  Type in_stack_fffffffffffff91c;
  aom_image_t *in_stack_fffffffffffff920;
  Message *in_stack_fffffffffffff968;
  AssertionResult *pAVar4;
  undefined7 in_stack_fffffffffffff970;
  undefined1 in_stack_fffffffffffff977;
  undefined1 uVar5;
  AssertionResult local_628 [2];
  undefined4 local_608;
  aom_codec_err_t local_604;
  AssertionResult local_600 [2];
  undefined4 local_5e0;
  Type local_5dc;
  AssertionResult local_5d8 [2];
  aom_image_t *local_5b8;
  undefined1 *local_5b0;
  AssertionResult local_5a8;
  undefined1 local_598 [200];
  undefined8 local_4d0;
  undefined4 local_4b8;
  aom_codec_err_t local_4b4;
  AssertionResult local_4b0 [2];
  undefined4 local_490;
  aom_codec_err_t local_48c;
  AssertionResult local_488 [2];
  undefined4 local_468;
  aom_codec_err_t local_464;
  AssertionResult local_460 [2];
  undefined4 local_43c;
  AssertionResult local_438;
  aom_codec_err_t local_424;
  aom_codec_ctx_t local_420;
  uint local_3e4;
  undefined4 local_3c0;
  aom_codec_err_t local_3bc;
  AssertionResult local_3b8;
  undefined4 local_39c;
  undefined4 local_398;
  undefined4 local_2d8;
  aom_codec_iface_t *local_20;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  
  local_c = 0x160;
  local_10 = 0x120;
  local_14 = 1;
  local_20 = aom_codec_av1_cx();
  local_3bc = aom_codec_enc_config_default
                        (in_stack_fffffffffffff900,
                         (aom_codec_enc_cfg_t *)
                         CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                         (uint)((ulong)in_stack_fffffffffffff8f0 >> 0x20));
  local_3c0 = 0;
  pAVar4 = &local_3b8;
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
             (char *)in_stack_fffffffffffff900,
             (aom_codec_err_t *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
             (aom_codec_err_t *)in_stack_fffffffffffff8f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff920);
    testing::AssertionResult::failure_message((AssertionResult *)0x562ab9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff920,in_stack_fffffffffffff91c,
               (char *)in_stack_fffffffffffff910,in_stack_fffffffffffff90c,
               (char *)in_stack_fffffffffffff900);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
               in_stack_fffffffffffff968);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff8f0);
    testing::Message::~Message((Message *)0x562b1c);
  }
  local_3e4 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x562b8a);
  if (local_3e4 == 0) {
    local_39c = 0x160;
    local_398 = 0x120;
    local_2d8 = 1;
    local_424 = aom_codec_enc_init_ver
                          ((aom_codec_ctx_t *)in_stack_fffffffffffff920,
                           (aom_codec_iface_t *)
                           CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918),
                           in_stack_fffffffffffff910,
                           CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
                           (int)((ulong)in_stack_fffffffffffff900 >> 0x20));
    local_43c = 0;
    testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
               (char *)in_stack_fffffffffffff900,
               (aom_codec_err_t *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
               (aom_codec_err_t *)in_stack_fffffffffffff8f0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_438);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff920);
      testing::AssertionResult::failure_message((AssertionResult *)0x562c98);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff920,in_stack_fffffffffffff91c,
                 (char *)in_stack_fffffffffffff910,in_stack_fffffffffffff90c,
                 (char *)in_stack_fffffffffffff900);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
                 in_stack_fffffffffffff968);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff8f0);
      testing::Message::~Message((Message *)0x562cfb);
    }
    local_3e4 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x562d69);
    if (local_3e4 == 0) {
      local_464 = aom_codec_control(&local_420,0xd,7);
      local_468 = 0;
      testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                ((char *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
                 (char *)in_stack_fffffffffffff900,
                 (aom_codec_err_t *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                 (aom_codec_err_t *)in_stack_fffffffffffff8f0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_460);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffff920);
        testing::AssertionResult::failure_message((AssertionResult *)0x562e48);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffff920,in_stack_fffffffffffff91c,
                   (char *)in_stack_fffffffffffff910,in_stack_fffffffffffff90c,
                   (char *)in_stack_fffffffffffff900);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
                   in_stack_fffffffffffff968);
        testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff8f0);
        testing::Message::~Message((Message *)0x562eab);
      }
      local_3e4 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x562f19);
      if (local_3e4 == 0) {
        local_48c = aom_codec_control(&local_420,0x2b,2);
        local_490 = 0;
        pAVar4 = local_488;
        testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                  ((char *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
                   (char *)in_stack_fffffffffffff900,
                   (aom_codec_err_t *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                   (aom_codec_err_t *)in_stack_fffffffffffff8f0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
        uVar5 = bVar1;
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffff920);
          testing::AssertionResult::failure_message((AssertionResult *)0x562ff8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffff920,in_stack_fffffffffffff91c,
                     (char *)in_stack_fffffffffffff910,in_stack_fffffffffffff90c,
                     (char *)in_stack_fffffffffffff900);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT17(uVar5,in_stack_fffffffffffff970),(Message *)pAVar4);
          testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff8f0);
          testing::Message::~Message((Message *)0x563055);
        }
        local_3e4 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x5630c3);
        if (local_3e4 == 0) {
          local_4b4 = aom_codec_control(&local_420,0x72,1);
          local_4b8 = 0;
          testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                    ((char *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
                     (char *)in_stack_fffffffffffff900,
                     (aom_codec_err_t *)
                     CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                     (aom_codec_err_t *)in_stack_fffffffffffff8f0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4b0);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffff920);
            testing::AssertionResult::failure_message((AssertionResult *)0x563196);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffff920,in_stack_fffffffffffff91c,
                       (char *)in_stack_fffffffffffff910,in_stack_fffffffffffff90c,
                       (char *)in_stack_fffffffffffff900);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)CONCAT17(uVar5,in_stack_fffffffffffff970),(Message *)pAVar4);
            testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff8f0);
            testing::Message::~Message((Message *)0x5631f3);
          }
          local_3e4 = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x563261);
          if (local_3e4 == 0) {
            local_4d0 = 0x25340;
            std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x563291);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffff910,
                       CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
                       (allocator_type *)in_stack_fffffffffffff900);
            std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x5632b7);
            local_5b0 = local_598;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x5632d9);
            local_5b8 = aom_img_wrap(in_stack_fffffffffffff920,in_stack_fffffffffffff91c,
                                     in_stack_fffffffffffff918,
                                     (uint)((ulong)in_stack_fffffffffffff910 >> 0x20),
                                     (uint)in_stack_fffffffffffff910,
                                     (uchar *)CONCAT44(in_stack_fffffffffffff90c,
                                                       in_stack_fffffffffffff908));
            testing::internal::EqHelper::Compare<aom_image_*,_aom_image_*,_nullptr>
                      ((char *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
                       (char *)in_stack_fffffffffffff900,
                       (aom_image **)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                       (aom_image **)in_stack_fffffffffffff8f0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5a8);
            if (!bVar1) {
              testing::Message::Message((Message *)in_stack_fffffffffffff920);
              in_stack_fffffffffffff920 =
                   (aom_image_t *)
                   testing::AssertionResult::failure_message((AssertionResult *)0x5633e4);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)in_stack_fffffffffffff920,in_stack_fffffffffffff91c,
                         (char *)in_stack_fffffffffffff910,in_stack_fffffffffffff90c,
                         (char *)in_stack_fffffffffffff900);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)CONCAT17(uVar5,in_stack_fffffffffffff970),(Message *)pAVar4
                        );
              testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff8f0);
              testing::Message::~Message((Message *)0x563441);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x563499);
            type = aom_codec_encode((aom_codec_ctx_t *)in_stack_fffffffffffff920,
                                    (aom_image_t *)
                                    CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918),
                                    (aom_codec_pts_t)in_stack_fffffffffffff910,
                                    CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
                                    (aom_enc_frame_flags_t)in_stack_fffffffffffff900);
            local_5e0 = 0;
            local_5dc = type;
            testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                      ((char *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
                       (char *)in_stack_fffffffffffff900,
                       (aom_codec_err_t *)
                       CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                       (aom_codec_err_t *)in_stack_fffffffffffff8f0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5d8);
            if (!bVar1) {
              testing::Message::Message((Message *)in_stack_fffffffffffff920);
              in_stack_fffffffffffff910 =
                   (aom_codec_enc_cfg_t *)
                   testing::AssertionResult::failure_message((AssertionResult *)0x56356d);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)in_stack_fffffffffffff920,type,
                         (char *)in_stack_fffffffffffff910,in_stack_fffffffffffff90c,
                         (char *)in_stack_fffffffffffff900);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)CONCAT17(uVar5,in_stack_fffffffffffff970),(Message *)pAVar4
                        );
              testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff8f0);
              testing::Message::~Message((Message *)0x5635ca);
            }
            local_3e4 = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x563638);
            if (local_3e4 == 0) {
              local_2d8 = 0;
              line = aom_codec_enc_config_set
                               ((aom_codec_ctx_t *)in_stack_fffffffffffff900,
                                (aom_codec_enc_cfg_t *)
                                CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
              local_608 = 8;
              local_604 = line;
              testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                        ((char *)CONCAT44(line,in_stack_fffffffffffff908),
                         (char *)in_stack_fffffffffffff900,
                         (aom_codec_err_t *)
                         CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                         (aom_codec_err_t *)in_stack_fffffffffffff8f0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(local_600);
              uVar3 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff908);
              if (!bVar1) {
                testing::Message::Message((Message *)in_stack_fffffffffffff920);
                in_stack_fffffffffffff900 =
                     (aom_codec_iface_t *)
                     testing::AssertionResult::failure_message((AssertionResult *)0x56371b);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)in_stack_fffffffffffff920,type,
                           (char *)in_stack_fffffffffffff910,line,(char *)in_stack_fffffffffffff900)
                ;
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)CONCAT17(uVar5,in_stack_fffffffffffff970),
                           (Message *)pAVar4);
                testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff8f0);
                testing::Message::~Message((Message *)0x563778);
              }
              local_3e4 = (uint)!bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x5637e6);
              if (local_3e4 == 0) {
                aVar2 = aom_codec_destroy(in_stack_fffffffffffff8e8);
                testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                          ((char *)CONCAT44(line,uVar3),(char *)in_stack_fffffffffffff900,
                           (aom_codec_err_t *)CONCAT44(aVar2,in_stack_fffffffffffff8f8),
                           (aom_codec_err_t *)in_stack_fffffffffffff8f0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool(local_628);
                if (!bVar1) {
                  testing::Message::Message((Message *)in_stack_fffffffffffff920);
                  this_00 = (AssertHelper *)
                            testing::AssertionResult::failure_message((AssertionResult *)0x5638b6);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)in_stack_fffffffffffff920,type,
                             (char *)in_stack_fffffffffffff910,line,
                             (char *)in_stack_fffffffffffff900);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)CONCAT17(uVar5,in_stack_fffffffffffff970),
                             (Message *)pAVar4);
                  testing::internal::AssertHelper::~AssertHelper(this_00);
                  testing::Message::~Message((Message *)0x563913);
                }
                local_3e4 = (uint)!bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x56397e);
                if (local_3e4 == 0) {
                  local_3e4 = 0;
                }
              }
            }
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffff900);
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST(FilmGrainEncodeTest, InitMonochrome1EncodeMonochrome0) {
  const int kWidth = 352;
  const int kHeight = 288;
  const int usage = AOM_USAGE_REALTIME;
  aom_codec_iface_t *iface = aom_codec_av1_cx();
  aom_codec_enc_cfg_t cfg;
  ASSERT_EQ(aom_codec_enc_config_default(iface, &cfg, usage), AOM_CODEC_OK);
  aom_codec_ctx_t enc;
  cfg.g_w = kWidth;
  cfg.g_h = kHeight;
  // Initialize encoder, with monochrome = 0.
  cfg.monochrome = 1;
  aom_codec_err_t init_status = aom_codec_enc_init(&enc, iface, &cfg, 0);
  ASSERT_EQ(init_status, AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AOME_SET_CPUUSED, 7), AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_TUNE_CONTENT, AOM_CONTENT_FILM),
            AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_DENOISE_NOISE_LEVEL, 1),
            AOM_CODEC_OK);
  // Set image with zero values.
  constexpr size_t kBufferSize =
      kWidth * kHeight + 2 * (kWidth + 1) / 2 * (kHeight + 1) / 2;
  std::vector<unsigned char> buffer(kBufferSize);
  aom_image_t img;
  EXPECT_EQ(&img, aom_img_wrap(&img, AOM_IMG_FMT_I420, kWidth, kHeight, 1,
                               buffer.data()));
  // Encode first frame.
  ASSERT_EQ(aom_codec_encode(&enc, &img, 0, 1, 0), AOM_CODEC_OK);
  // Second frame: update config with monochrome = 1.
  cfg.monochrome = 0;
  ASSERT_EQ(aom_codec_enc_config_set(&enc, &cfg), AOM_CODEC_INVALID_PARAM);
  ASSERT_EQ(aom_codec_destroy(&enc), AOM_CODEC_OK);
}